

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_set_callback_data2(archive *_a,void *client_data,uint iindex)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_set_callback_data2");
  if (iVar1 == -0x1e) {
    return -0x1e;
  }
  uVar2 = _a[1].current_codepage;
  if (uVar2 == 0) {
    pcVar3 = (char *)calloc(1,0x18);
    _a[1].read_data_block = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "No memory.";
      iVar1 = 0xc;
      goto LAB_00753982;
    }
    _a[1].current_codepage = 1;
    uVar2 = 1;
  }
  if (iindex <= uVar2 - 1) {
    pcVar3 = _a[1].read_data_block;
    *(void **)(pcVar3 + (ulong)iindex * 0x18 + 0x10) = client_data;
    pcVar3 = pcVar3 + (ulong)iindex * 0x18;
    pcVar3[0] = -1;
    pcVar3[1] = -1;
    pcVar3[2] = -1;
    pcVar3[3] = -1;
    pcVar3[4] = -1;
    pcVar3[5] = -1;
    pcVar3[6] = -1;
    pcVar3[7] = -1;
    pcVar3[8] = -1;
    pcVar3[9] = -1;
    pcVar3[10] = -1;
    pcVar3[0xb] = -1;
    pcVar3[0xc] = -1;
    pcVar3[0xd] = -1;
    pcVar3[0xe] = -1;
    pcVar3[0xf] = -1;
    return 0;
  }
  pcVar3 = "Invalid index specified.";
  iVar1 = 0x16;
LAB_00753982:
  archive_set_error(_a,iVar1,pcVar3);
  return -0x1e;
}

Assistant:

int
archive_read_set_callback_data2(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_set_callback_data2");

	if (a->client.nodes == 0)
	{
		a->client.dataset = (struct archive_read_data_node *)
		    calloc(1, sizeof(*a->client.dataset));
		if (a->client.dataset == NULL)
		{
			archive_set_error(&a->archive, ENOMEM,
				"No memory.");
			return ARCHIVE_FATAL;
		}
		a->client.nodes = 1;
	}

	if (iindex > a->client.nodes - 1)
	{
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}